

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O1

void __thiscall
FPCXTexture::ReadPCX4bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  BYTE *__s;
  ulong uVar8;
  byte *pbVar9;
  byte bVar10;
  
  pvVar3 = operator_new__((ulong)hdr->bytesPerScanLine);
  uVar8 = lump->Length - 0x80;
  pbVar4 = (byte *)operator_new__(uVar8);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pbVar4,uVar8);
  if ((this->super_FTexture).Height != 0) {
    iVar7 = 0;
    bVar10 = 0;
    uVar5 = 0;
    pbVar9 = pbVar4;
    do {
      uVar1 = (this->super_FTexture).Width;
      __s = dst + uVar1 * uVar5;
      memset(__s,0,(ulong)uVar1);
      iVar2 = 0;
      do {
        uVar1 = hdr->bytesPerScanLine;
        if (uVar1 != 0) {
          lVar6 = 0;
          do {
            if (iVar7 == 0) {
              bVar10 = *pbVar9;
              if (bVar10 < 0xc0) {
                pbVar9 = pbVar9 + 1;
                iVar7 = 1;
              }
              else {
                iVar7 = bVar10 - 0xc0;
                bVar10 = pbVar9[1];
                pbVar9 = pbVar9 + 2;
              }
            }
            iVar7 = iVar7 + -1;
            *(byte *)((long)pvVar3 + lVar6) = bVar10;
            lVar6 = lVar6 + 1;
          } while ((uint)uVar1 != (uint)lVar6);
        }
        if ((this->super_FTexture).Width != 0) {
          uVar8 = 0;
          do {
            if ((char)(*(char *)((long)pvVar3 + (uVar8 >> 3 & 0x1fffffff)) << ((byte)uVar8 & 7)) <
                '\0') {
              __s[uVar8] = __s[uVar8] + (char)(1 << ((byte)iVar2 & 0x1f));
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (this->super_FTexture).Width);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_FTexture).Height);
  }
  operator_delete__(pvVar3);
  operator_delete__(pbVar4);
  return;
}

Assistant:

void FPCXTexture::ReadPCX4bits (BYTE *dst, FileReader & lump, PCXHeader *hdr)
{
	int rle_count = 0, rle_value = 0;
	int x, y, c;
	int bytes;
	BYTE * line = new BYTE[hdr->bytesPerScanLine];
	BYTE * colorIndex = new BYTE[Width];

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		BYTE * ptr = &dst[y * Width];
		memset (ptr, 0, Width * sizeof (BYTE));

		for (c = 0; c < 4; ++c)
		{
			BYTE * pLine = line;

			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if ( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				*(pLine++) = rle_value;
			}

			/* compute line's color indexes */
			for (x = 0; x < Width; ++x)
			{
				if (line[x / 8] & (128 >> (x % 8)))
					ptr[x] += (1 << c);
			}
		}
	}

	/* release memory */
	delete [] colorIndex;
	delete [] line;
	delete [] srcp;
}